

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O0

void sysbvm_jit_patchTrampolineWithRealEntryPoint
               (sysbvm_bytecodeJit_t *jit,sysbvm_functionBytecode_t *bytecode)

{
  _Bool _Var1;
  sysbvm_intptr_t sVar2;
  void *executablePointer;
  void *writePointer;
  uintptr_t *jumpAddressLocation;
  size_t targetAddressOffset;
  size_t trampolineCodeSize;
  uint8_t *trampolineEntryPointWritePointer;
  uint8_t *trampolineEntryPointExecutePointer;
  uint8_t *realEntryPoint;
  sysbvm_functionBytecode_t *bytecode_local;
  sysbvm_bytecodeJit_t *jit_local;
  
  if (((bytecode->jittedCodeTrampoline != 0) && (bytecode->jittedCodeTrampolineWritePointer != 0))
     && (bytecode->jittedCodeTrampolineSessionToken == (jit->context->roots).sessionToken)) {
    sVar2 = sysbvm_tuple_systemHandle_decode(bytecode->jittedCode);
    executablePointer = (void *)sysbvm_tuple_systemHandle_decode(bytecode->jittedCodeTrampoline);
    writePointer = (void *)sysbvm_tuple_systemHandle_decode
                                     (bytecode->jittedCodeTrampolineWritePointer);
    _Var1 = sysbvm_virtualMemory_lockCodePagesForWriting(writePointer,executablePointer,0x10);
    if (!_Var1) {
      abort();
    }
    *(sysbvm_intptr_t *)((long)writePointer + 6) = sVar2;
    sysbvm_virtualMemory_unlockCodePagesForExecution(writePointer,executablePointer,0x10);
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_jit_patchTrampolineWithRealEntryPoint(sysbvm_bytecodeJit_t *jit, sysbvm_functionBytecode_t *bytecode)
{
    if(bytecode->jittedCodeTrampoline && bytecode->jittedCodeTrampolineWritePointer && bytecode->jittedCodeTrampolineSessionToken == jit->context->roots.sessionToken)
    {
        uint8_t *realEntryPoint = (uint8_t*)sysbvm_tuple_systemHandle_decode(bytecode->jittedCode);
        uint8_t *trampolineEntryPointExecutePointer = (uint8_t*)sysbvm_tuple_systemHandle_decode(bytecode->jittedCodeTrampoline);
        uint8_t *trampolineEntryPointWritePointer = (uint8_t*)sysbvm_tuple_systemHandle_decode(bytecode->jittedCodeTrampolineWritePointer);

        size_t trampolineCodeSize = 16;
        if(!sysbvm_virtualMemory_lockCodePagesForWriting(trampolineEntryPointWritePointer, trampolineEntryPointExecutePointer, trampolineCodeSize))
            abort();

        size_t targetAddressOffset = trampolineCodeSize - 2 - sizeof(void*);
        uintptr_t *jumpAddressLocation = (uintptr_t*)(trampolineEntryPointWritePointer + targetAddressOffset);
        *jumpAddressLocation = (uintptr_t)realEntryPoint;

        sysbvm_virtualMemory_unlockCodePagesForExecution(trampolineEntryPointWritePointer, trampolineEntryPointExecutePointer, trampolineCodeSize);
    }
}